

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

char * myStrdupFunc(char *str)

{
  int iVar1;
  size_t sVar2;
  char *ret;
  size_t size;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    sVar2 = strlen(str);
    sVar2 = sVar2 + 1;
    iVar1 = xmlMemUsed();
    if ((ulong)(long)xmllintMaxmem < (long)iVar1 + sVar2) {
      xmllintMaxmemReached = 1;
      xmllintOom = 1;
      str_local = (char *)0x0;
    }
    else {
      str_local = (char *)xmlMemMalloc(sVar2);
      if (str_local == (char *)0x0) {
        xmllintOom = 1;
        str_local = (char *)0x0;
      }
      else {
        memcpy(str_local,str,sVar2);
      }
    }
  }
  return str_local;
}

Assistant:

static char *
myStrdupFunc(const char *str) {
    size_t size;
    char *ret;

    if (str == NULL)
        return(NULL);

    size = strlen(str) + 1;
    if (xmlMemUsed() + size > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemMalloc(size);
    if (ret == NULL) {
        xmllintOom = 1;
        return(NULL);
    }

    memcpy(ret, str, size);

    return(ret);
}